

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_gains.hpp
# Opt level: O3

void __thiscall ear::OutputGainsT<float>::check_size(OutputGainsT<float> *this,size_t n)

{
  invalid_argument *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (*(long *)(this->vec + 8) - *(long *)this->vec >> 2 == n) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"incorrect size for output vector","");
  std::invalid_argument::invalid_argument(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__invalid_argument_0020f220;
  __cxa_throw(this_00,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

virtual void check_size(size_t n) override {
      if (vec.size() != n) {
        throw invalid_argument("incorrect size for output vector");
      }
    }